

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O0

FileName * __thiscall embree::FileName::path(FileName *this)

{
  string *in;
  FileName *in_RSI;
  FileName *in_RDI;
  size_t pos;
  string local_38 [32];
  FileName *this_00;
  
  this_00 = in_RSI;
  in = (string *)std::__cxx11::string::find_last_of((char)in_RSI,0x2f);
  if (in == (string *)0xffffffffffffffff) {
    FileName((FileName *)0x49d51d);
  }
  else {
    std::__cxx11::string::substr((ulong)local_38,(ulong)in_RSI);
    FileName(this_00,in);
    std::__cxx11::string::~string(local_38);
  }
  return in_RDI;
}

Assistant:

FileName FileName::path() const {
    size_t pos = filename.find_last_of(path_sep);
    if (pos == std::string::npos) return FileName();
    return filename.substr(0,pos);
  }